

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

void __thiscall QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  QUtcTimeZonePrivate *in_RDI;
  long in_FS_OFFSET;
  QString name;
  QTimeZonePrivate *in_stack_ffffffffffffff80;
  EVP_PKEY_CTX local_40 [24];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTimeZonePrivate::QTimeZonePrivate(in_stack_ffffffffffffff80);
  (in_RDI->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_00beb5a0;
  QString::QString((QString *)0x73bf6d);
  QString::QString((QString *)0x73bf80);
  QString::QString((QString *)0x73bf93);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTimeZonePrivate::utcQString();
  QTimeZonePrivate::utcQByteArray();
  init(in_RDI,local_40);
  QByteArray::~QByteArray((QByteArray *)0x73bff5);
  QString::~QString((QString *)0x73bfff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate()
{
    const QString name = utcQString();
    init(utcQByteArray(), 0, name, name, QLocale::AnyTerritory, name);
}